

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeid.h
# Opt level: O1

void pybind11::detail::clean_type_id(string *name)

{
  char *pcVar1;
  char *__s;
  ulong uVar2;
  int status;
  undefined8 local_38;
  undefined2 local_30;
  undefined1 local_2e;
  int local_24;
  
  local_24 = 0;
  __s = (char *)__cxa_demangle((name->_M_dataplus)._M_p,0,0,&local_24);
  if (local_24 == 0) {
    pcVar1 = (char *)name->_M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)name,0,pcVar1,(ulong)__s);
  }
  local_38 = 0x3131646e69627970;
  local_30 = 0x3a3a;
  local_2e = 0;
  for (uVar2 = std::__cxx11::string::find((char *)name,(ulong)&local_38,0);
      uVar2 != 0xffffffffffffffff;
      uVar2 = std::__cxx11::string::find((char *)name,(ulong)&local_38,uVar2)) {
    std::__cxx11::string::erase((ulong)name,uVar2);
  }
  if (__s != (char *)0x0) {
    free(__s);
  }
  return;
}

Assistant:

PYBIND11_NOINLINE void clean_type_id(std::string &name) {
#if defined(__GNUG__)
    int status = 0;
    std::unique_ptr<char, void (*)(void *)> res{
        abi::__cxa_demangle(name.c_str(), nullptr, nullptr, &status), std::free};
    if (status == 0) {
        name = res.get();
    }
#else
    detail::erase_all(name, "class ");
    detail::erase_all(name, "struct ");
    detail::erase_all(name, "enum ");
#endif
    detail::erase_all(name, "pybind11::");
}